

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::egl::MultiThreadedTest::iterate(MultiThreadedTest *this)

{
  ostringstream *poVar1;
  TestContext *this_00;
  ulong uVar2;
  qpTestResult testResult;
  TestThread *pTVar3;
  pointer ppTVar4;
  deUint64 dVar5;
  MessageBuilder *pMVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  char *description;
  int threadNdx;
  IterateResult IVar10;
  bool bVar11;
  pointer ppTVar12;
  size_type __new_size;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int threadNdx_1;
  long lVar16;
  bool bVar17;
  ulong uVar18;
  vector<int,_std::allocator<int>_> messageNdx;
  undefined1 local_1b0 [384];
  
  if (this->m_initialized == true) {
    ppTVar4 = (this->m_threads).
              super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppTVar12 = (this->m_threads).
               super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    uVar7 = (long)ppTVar12 - (long)ppTVar4;
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Thread timeout limit: ");
    pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&this->m_timeoutUs);
    std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"us");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::vector<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>::reserve
              (&this->m_threads,(long)this->m_threadCount);
    for (iVar13 = 0; iVar13 < this->m_threadCount; iVar13 = iVar13 + 1) {
      pTVar3 = (TestThread *)operator_new(0x1b8);
      TestThread::TestThread(pTVar3,this,iVar13);
      local_1b0._0_8_ = pTVar3;
      std::vector<deqp::egl::TestThread*,std::allocator<deqp::egl::TestThread*>>::
      emplace_back<deqp::egl::TestThread*>
                ((vector<deqp::egl::TestThread*,std::allocator<deqp::egl::TestThread*>> *)
                 &this->m_threads,(TestThread **)local_1b0);
    }
    dVar5 = deGetMicroseconds();
    this->m_startTimeUs = dVar5;
    lVar16 = 0;
    while( true ) {
      ppTVar4 = (this->m_threads).
                super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppTVar12 = (this->m_threads).
                 super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      uVar7 = (long)ppTVar12 - (long)ppTVar4;
      if ((int)(uVar7 >> 3) <= lVar16) break;
      de::Thread::start(&ppTVar4[lVar16]->super_Thread);
      lVar16 = lVar16 + 1;
    }
    this->m_initialized = true;
  }
  uVar8 = 0;
  uVar9 = uVar7 >> 3 & 0xffffffff;
  if ((int)(uVar7 >> 3) < 1) {
    uVar9 = uVar8;
  }
  iVar13 = 0;
  for (; uVar9 != uVar8; uVar8 = uVar8 + 1) {
    iVar13 = iVar13 + (uint)(ppTVar4[uVar8]->m_status != THREADSTATUS_RUNNING);
  }
  if (iVar13 == this->m_threadCount) {
    for (lVar16 = 0; lVar16 < (int)((ulong)((long)ppTVar12 - (long)ppTVar4) >> 3);
        lVar16 = lVar16 + 1) {
      de::Thread::join(&ppTVar4[lVar16]->super_Thread);
      ppTVar4 = (this->m_threads).
                super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppTVar12 = (this->m_threads).
                 super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    }
    __new_size = (long)ppTVar12 - (long)ppTVar4 >> 3;
    uVar7 = 0;
    uVar9 = 0;
    if (0 < (int)__new_size) {
      uVar9 = __new_size & 0xffffffff;
    }
    bVar11 = true;
    bVar17 = false;
    for (; uVar9 != uVar7; uVar7 = uVar7 + 1) {
      bVar11 = (bool)(bVar11 & ppTVar4[uVar7]->m_status != THREADSTATUS_ERROR);
      bVar17 = (bool)(bVar17 | ppTVar4[uVar7]->m_status == THREADSTATUS_NOT_SUPPORTED);
    }
    messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
    std::vector<int,_std::allocator<int>_>::resize
              (&messageNdx,__new_size,(value_type_conflict1 *)local_1b0);
    poVar1 = (ostringstream *)(local_1b0 + 8);
    while( true ) {
      ppTVar4 = (this->m_threads).
                super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar7 = (ulong)((long)(this->m_threads).
                            super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4) >> 3;
      uVar9 = uVar7 & 0xffffffff;
      if ((int)uVar7 < 1) {
        uVar9 = 0;
      }
      uVar7 = 0xffffffffffffffff;
      uVar8 = 0;
      for (uVar14 = 0; iVar13 = (int)uVar7, uVar9 != uVar14; uVar14 = uVar14 + 1) {
        pTVar3 = ppTVar4[uVar14];
        lVar16 = *(long *)&(pTVar3->m_log).m_messages.
                           super__Vector_base<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                           ._M_impl.super__Vector_impl_data;
        if (messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[uVar14] <
            (int)(((long)(pTVar3->m_log).m_messages.
                         super__Vector_base<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                         ._M_impl.super__Vector_impl_data._M_finish - lVar16) / 0x28)) {
          uVar18 = *(ulong *)(lVar16 + (long)messageNdx.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start[uVar14] * 0x28);
          if (uVar18 < uVar8 || iVar13 == -1) {
            uVar7 = uVar14;
          }
          uVar7 = uVar7 & 0xffffffff;
          if (uVar18 < uVar8 || iVar13 == -1) {
            uVar8 = uVar18;
          }
        }
      }
      if (iVar13 == -1) break;
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"[");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,"] (");
      std::ostream::operator<<(poVar1,iVar13);
      std::operator<<((ostream *)poVar1,") ");
      std::operator<<((ostream *)poVar1,
                      (string *)
                      (*(long *)&((this->m_threads).
                                  super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[iVar13]->m_log).
                                 m_messages.
                                 super__Vector_base<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                                 ._M_impl.super__Vector_impl_data +
                       (long)messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar13] * 0x28 + 8));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[iVar13] =
           messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar13] + 1;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&messageNdx.super__Vector_base<int,_std::allocator<int>_>);
    lVar16 = 0;
    while( true ) {
      ppTVar4 = (this->m_threads).
                super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppTVar12 = (this->m_threads).
                 super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if ((int)((ulong)((long)ppTVar12 - (long)ppTVar4) >> 3) <= lVar16) break;
      if (ppTVar4[lVar16] != (TestThread *)0x0) {
        (*(ppTVar4[lVar16]->super_Thread)._vptr_Thread[1])();
      }
      lVar16 = lVar16 + 1;
    }
    if (ppTVar12 != ppTVar4) {
      (this->m_threads).
      super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppTVar4;
    }
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar11) {
      if (!bVar17) {
        tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
        return STOP;
      }
      description = "Not Supported";
      testResult = QP_TEST_RESULT_NOT_SUPPORTED;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    tcu::TestContext::setTestResult(this_00,testResult,description);
    IVar10 = STOP;
  }
  else {
    dVar5 = deGetMicroseconds();
    uVar9 = dVar5 - this->m_startTimeUs;
    uVar7 = this->m_timeoutUs;
    if (uVar7 < uVar9) {
      messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1b0._0_8_ = local_1b0._0_8_ & 0xffffffff00000000;
      std::vector<int,_std::allocator<int>_>::resize
                (&messageNdx,
                 (long)(this->m_threads).
                       super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_threads).
                       super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3,
                 (value_type_conflict1 *)local_1b0);
      poVar1 = (ostringstream *)(local_1b0 + 8);
      while( true ) {
        ppTVar4 = (this->m_threads).
                  super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar14 = (ulong)((long)(this->m_threads).
                               super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar4) >> 3;
        uVar8 = uVar14 & 0xffffffff;
        if ((int)uVar14 < 1) {
          uVar8 = 0;
        }
        uVar14 = 0xffffffffffffffff;
        uVar18 = 0;
        for (uVar15 = 0; iVar13 = (int)uVar14, uVar8 != uVar15; uVar15 = uVar15 + 1) {
          pTVar3 = ppTVar4[uVar15];
          lVar16 = *(long *)&(pTVar3->m_log).m_messages.
                             super__Vector_base<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                             ._M_impl.super__Vector_impl_data;
          if (messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar15] <
              (int)(((long)(pTVar3->m_log).m_messages.
                           super__Vector_base<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                           ._M_impl.super__Vector_impl_data._M_finish - lVar16) / 0x28)) {
            uVar2 = *(ulong *)(lVar16 + (long)messageNdx.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[uVar15] * 0x28);
            if (uVar2 < uVar18 || iVar13 == -1) {
              uVar14 = uVar15;
            }
            uVar14 = uVar14 & 0xffffffff;
            if (uVar2 < uVar18 || iVar13 == -1) {
              uVar18 = uVar2;
            }
          }
        }
        if (iVar13 == -1) break;
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::operator<<((ostream *)poVar1,"[");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,"] (");
        std::ostream::operator<<(poVar1,iVar13);
        std::operator<<((ostream *)poVar1,") ");
        std::operator<<((ostream *)poVar1,
                        (string *)
                        (*(long *)&((this->m_threads).
                                    super__Vector_base<deqp::egl::TestThread_*,_std::allocator<deqp::egl::TestThread_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[iVar13]->m_log).
                                   m_messages.
                                   super__Vector_base<deqp::egl::ThreadLog::Message,_std::allocator<deqp::egl::ThreadLog::Message>_>
                                   ._M_impl.super__Vector_impl_data +
                         (long)messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar13] * 0x28 + 8));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[iVar13] =
             messageNdx.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[iVar13] + 1;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&messageNdx.super__Vector_base<int,_std::allocator<int>_>);
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"[");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,"] (-) Timeout, Limit: ");
      pMVar6 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1b0,&this->m_timeoutUs);
      std::operator<<(&(pMVar6->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"us");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1b0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::operator<<((ostream *)poVar1,"[");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::operator<<((ostream *)poVar1,"] (-) Trying to perform resource cleanup...");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    else {
      deSleep(10);
    }
    IVar10 = (IterateResult)(uVar9 <= uVar7);
  }
  return IVar10;
}

Assistant:

TestCase::IterateResult MultiThreadedTest::iterate (void)
{
	if (!m_initialized)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Thread timeout limit: " << m_timeoutUs << "us" << tcu::TestLog::EndMessage;

		// Create threads
		m_threads.reserve(m_threadCount);

		for (int threadNdx = 0; threadNdx < m_threadCount; threadNdx++)
			m_threads.push_back(new TestThread(*this, threadNdx));

		m_startTimeUs = deGetMicroseconds();

		// Run threads
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			m_threads[threadNdx]->start();

		m_initialized = true;
	}

	int readyCount = 0;
	for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
	{
		if (m_threads[threadNdx]->getStatus() != TestThread::THREADSTATUS_RUNNING)
			readyCount++;
	}

	if (readyCount == m_threadCount)
	{
		// Join threads
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			m_threads[threadNdx]->join();

		bool isOk			= true;
		bool notSupported	= false;

		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
		{
			if (m_threads[threadNdx]->getStatus() == TestThread::THREADSTATUS_ERROR)
				isOk = false;

			if (m_threads[threadNdx]->getStatus() == TestThread::THREADSTATUS_NOT_SUPPORTED)
				notSupported = true;
		}

		// Get logs
		{
			vector<int> messageNdx;

			messageNdx.resize(m_threads.size(), 0);

			while (true)
			{
				int			nextThreadNdx		= -1;
				deUint64	nextThreadTimeUs	= 0;

				for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
				{
					if (messageNdx[threadNdx] >= (int)m_threads[threadNdx]->getLog().getMessages().size())
						continue;

					if (nextThreadNdx == -1 || nextThreadTimeUs > m_threads[threadNdx]->getLog().getMessages()[messageNdx[threadNdx]].timeUs)
					{
						nextThreadNdx		= threadNdx;
						nextThreadTimeUs	= m_threads[threadNdx]->getLog().getMessages()[messageNdx[threadNdx]].timeUs;
					}
				}

				if (nextThreadNdx == -1)
					break;

				m_testCtx.getLog() << tcu::TestLog::Message << "[" << (nextThreadTimeUs - m_startTimeUs) << "] (" << nextThreadNdx << ") " << m_threads[nextThreadNdx]->getLog().getMessages()[messageNdx[nextThreadNdx]].msg << tcu::TestLog::EndMessage;

				messageNdx[nextThreadNdx]++;
			}
		}

		// Destroy threads
		for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
			delete m_threads[threadNdx];

		m_threads.clear();

		// Set result
		if (isOk)
		{
			if (notSupported)
				m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
			else
				m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		}
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}
	else
	{
		// Check for timeout
		const deUint64 currentTimeUs = deGetMicroseconds();

		if (currentTimeUs - m_startTimeUs > m_timeoutUs)
		{
			// Get logs
			{
				vector<int> messageNdx;

				messageNdx.resize(m_threads.size(), 0);

				while (true)
				{
					int			nextThreadNdx		= -1;
					deUint64	nextThreadTimeUs	= 0;

					for (int threadNdx = 0; threadNdx < (int)m_threads.size(); threadNdx++)
					{
						if (messageNdx[threadNdx] >= (int)m_threads[threadNdx]->getLog().getMessages().size())
							continue;

						if (nextThreadNdx == -1 || nextThreadTimeUs > m_threads[threadNdx]->getLog().getMessages()[messageNdx[threadNdx]].timeUs)
						{
							nextThreadNdx		= threadNdx;
							nextThreadTimeUs	= m_threads[threadNdx]->getLog().getMessages()[messageNdx[threadNdx]].timeUs;
						}
					}

					if (nextThreadNdx == -1)
						break;

					m_testCtx.getLog() << tcu::TestLog::Message << "[" << (nextThreadTimeUs - m_startTimeUs) << "] (" << nextThreadNdx << ") " << m_threads[nextThreadNdx]->getLog().getMessages()[messageNdx[nextThreadNdx]].msg << tcu::TestLog::EndMessage;

					messageNdx[nextThreadNdx]++;
				}
			}

			m_testCtx.getLog() << tcu::TestLog::Message << "[" << (currentTimeUs - m_startTimeUs) << "] (-) Timeout, Limit: " << m_timeoutUs << "us" << tcu::TestLog::EndMessage;
			m_testCtx.getLog() << tcu::TestLog::Message << "[" << (currentTimeUs - m_startTimeUs) << "] (-) Trying to perform resource cleanup..." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		// Sleep
		deSleep(10);
	}

	return CONTINUE;
}